

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnode::ComputeQ
          (ChLoadXYZROTnode *this,ChState *state_x,ChStateDelta *state_w)

{
  int iVar1;
  undefined4 extraout_var;
  ChVectorDynamic<> *vector;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> mnode;
  undefined1 local_198 [16];
  double local_188;
  ChCoordsys<double> local_160;
  undefined1 *local_128 [2];
  ChFrameMoving<double> local_118;
  
  std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyzrot,chrono::ChLoadable>
            ((shared_ptr<chrono::ChLoadable> *)&mnode);
  iVar1 = (*((mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[8])();
  if (*(char *)(CONCAT44(extraout_var,iVar1) + 0x2c) == '\0') {
    local_160.pos.m_data[0] = (double)&DAT_3ff0000000000000;
    local_188 = 0.0;
    local_160.rot.m_data[0] = 0.0;
    local_198._0_8_ = (PointerType)0x0;
    local_198._8_8_ = 0.0;
    local_160.pos.m_data[1] = 0.0;
    local_160.pos.m_data[2] = 0.0;
    ChFrameMoving<double>::ChFrameMoving
              (&local_118,(ChVector<double> *)local_198,(ChQuaternion<double> *)&local_160);
    if (state_x == (ChState *)0x0) {
      ChFrame<double>::SetCoord
                (&local_118.super_ChFrame<double>,
                 (ChCoordsys<double> *)
                 &((mnode.
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAbase).field_0x20);
    }
    else {
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_198,
                 &state_x->super_ChVectorDynamic<double>,0,7);
      ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                (&local_160,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                 local_198,(type *)0x0);
      ChFrame<double>::SetCoord(&local_118.super_ChFrame<double>,&local_160);
    }
    if (state_w == (ChStateDelta *)0x0) {
      ChCoordsys<double>::operator=
                (&local_118.coord_dt,
                 (ChCoordsys<double> *)
                 &(mnode.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->field_0xa0);
    }
    else {
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_160,
                 &state_w->super_ChVectorDynamic<double>,0,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                ((ChVector<double> *)local_198,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                 &local_160,(type *)0x0);
      local_118.coord_dt.pos.m_data[0] = (double)local_198._0_8_;
      local_118.coord_dt.pos.m_data[1] = (double)local_198._8_8_;
      local_118.coord_dt.pos.m_data[2] = local_188;
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_160,
                 &state_w->super_ChVectorDynamic<double>,3,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                ((ChVector<double> *)local_198,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                 &local_160,(type *)0x0);
      ChFrameMoving<double>::SetWvel_loc(&local_118,(ChVector<double> *)local_198);
    }
    (*(this->super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj[0x16])
              (this,&local_118,&this->computed_abs_force,&this->computed_abs_torque);
    vector = &(this->super_ChLoadCustom).load_Q;
    local_198._0_8_ = &this->computed_abs_force;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_160,vector,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_160,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_198);
    ChQuaternion<double>::RotateBack
              (&local_118.super_ChFrame<double>.coord.rot,&this->computed_abs_torque);
    local_128[0] = local_198;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_160,vector,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_160,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_128);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void ChLoadXYZROTnode::ComputeQ(ChState* state_x, ChStateDelta* state_w) {
    auto mnode = std::dynamic_pointer_cast<ChNodeFEAxyzrot>(this->loadable);
    if (!mnode->Variables().IsActive())
        return;

    ChFrameMoving<> bodycoordA;

    if (state_x) {
        // the numerical jacobian algo might change state_x
        bodycoordA.SetCoord(state_x->segment(0, 7));
    } else {
        bodycoordA.SetCoord(mnode->coord);
    }

    if (state_w) {
        // the numerical jacobian algo might change state_w
        bodycoordA.SetPos_dt(state_w->segment(0, 3));
        bodycoordA.SetWvel_loc(state_w->segment(3, 3));
    } else {
        bodycoordA.SetCoord_dt(mnode->GetCoord_dt());
    }

    ComputeForceTorque(bodycoordA, computed_abs_force, computed_abs_torque);

    // Compute Q
    load_Q.segment(0, 3) = computed_abs_force.eigen();
    load_Q.segment(3, 3) =
        (bodycoordA.coord.rot.RotateBack(computed_abs_torque)).eigen();  // because Q expect torque in local frame
}